

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

interval_t
duckdb::BinaryLambdaWrapperWithNulls::
Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
          (timestamp_t param_1,timestamp_t param_2,TemplatedValidityMask<unsigned_long> *param_3,
          idx_t param_4)

{
  interval_t iVar1;
  
  if ((((param_1.value == -0x7fffffffffffffff) || (param_1.value == 0x7fffffffffffffff)) ||
      (param_2.value == -0x7fffffffffffffff)) || (param_2.value == 0x7fffffffffffffff)) {
    TemplatedValidityMask<unsigned_long>::SetInvalid(param_3,param_4);
    iVar1 = (interval_t)ZEXT816(0);
  }
  else {
    iVar1 = (interval_t)duckdb::Interval::GetAge(param_1,param_2);
  }
  return iVar1;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right, mask, idx);
	}